

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

char * addenv(cgi_env_block *block,char *fmt,...)

{
  int iVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  __s = block->buf + block->len;
  uVar3 = 0x1ffe - block->len;
  if (0 < (int)uVar3) {
    local_d8 = local_c8;
    local_e0 = &ap[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    iVar2 = vsnprintf(__s,(ulong)uVar3,fmt,&local_e8);
    if ((0 < iVar2) && (iVar2 + 1U < uVar3)) {
      iVar1 = block->nvars;
      if ((long)iVar1 < 0x3e) {
        block->nvars = iVar1 + 1;
        block->vars[iVar1] = __s;
        block->len = block->len + iVar2 + 1U;
      }
    }
  }
  return __s;
}

Assistant:

static char *addenv(struct cgi_env_block *block, const char *fmt, ...) {
    int n, space;
    char *added = block->buf + block->len;
    va_list ap;

    /* Calculate how much space is left in the buffer */
    space = sizeof(block->buf) - (block->len + 2);
    if (space > 0) {
        /* Copy VARIABLE=VALUE\0 string into the free space */
        va_start(ap, fmt);
        n = vsnprintf(added, (size_t) space, fmt, ap);
        va_end(ap);

        /* Make sure we do not overflow buffer and the envp array */
        if (n > 0 && n + 1 < space &&
            block->nvars < (int) ARRAY_SIZE(block->vars) - 2) {
            /* Append a pointer to the added string into the envp array */
            block->vars[block->nvars++] = added;
            /* Bump up used length counter. Include \0 terminator */
            block->len += n + 1;
        }
    }

    return added;
}